

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O1

int __thiscall strict_fstream::ifstream::open(ifstream *this,char *__file,int __oflag,...)

{
  _func_int *p_Var1;
  int extraout_EAX;
  openmode mode;
  
  mode = __oflag | _S_in;
  p_Var1 = (this->super_ifstream).super_basic_istream<char,_std::char_traits<char>_>.
           _vptr_basic_istream[-3];
  *(undefined4 *)
   (&(this->super_ifstream).super_basic_istream<char,_std::char_traits<char>_>.field_0x1c +
   (long)p_Var1) = 1;
  std::ios::clear((int)this + (int)p_Var1);
  detail::static_method_holder::check_mode((string *)__file,mode);
  std::ifstream::open((string *)this,(_Ios_Openmode)__file);
  detail::static_method_holder::check_open
            ((ios *)((long)&(this->super_ifstream).
                            super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream +
                    (long)(this->super_ifstream).super_basic_istream<char,_std::char_traits<char>_>.
                          _vptr_basic_istream[-3]),(string *)__file,mode);
  detail::static_method_holder::check_peek((istream *)this,(string *)__file,mode);
  return extraout_EAX;
}

Assistant:

void open(const std::string& filename, std::ios_base::openmode mode = std::ios_base::in)
    {
        mode |= std::ios_base::in;
        exceptions(std::ios_base::badbit);
        detail::static_method_holder::check_mode(filename, mode);
        std::ifstream::open(filename, mode);
        detail::static_method_holder::check_open(this, filename, mode);
        detail::static_method_holder::check_peek(this, filename, mode);
    }